

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

char * logging_get_names(void)

{
  Node *pNVar1;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  iterator i;
  Node *pNVar5;
  Node *pNVar6;
  char *pcVar7;
  char *__dest;
  
  pcVar3 = jh_log_names_buffer;
  if (jh_log_names_buffer == (char *)0x0) {
    pNVar1 = file_data_list->mTail;
    uVar4 = 1;
    pNVar5 = file_data_list->mHead->next;
    for (pNVar6 = pNVar5; pNVar6 != pNVar1; pNVar6 = pNVar6->next) {
      sVar2 = strlen((pNVar6->val).filename);
      uVar4 = uVar4 + (int)sVar2 + 1;
    }
    if (uVar4 == 1) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = (char *)malloc((ulong)uVar4);
      __dest = pcVar3;
      jh_log_names_buffer = pcVar3;
      for (; pNVar5 != pNVar1; pNVar5 = pNVar5->next) {
        strcpy(__dest,(pNVar5->val).filename);
        sVar2 = strlen((pNVar5->val).filename);
        pcVar7 = __dest + sVar2;
        __dest = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      __dest[-1] = '\0';
    }
  }
  return pcVar3;
}

Assistant:

const char* logging_get_names()
{
	uint32_t size = 1;
	char* temp;

	TRACE_BEGIN(LOG_LVL_INFO);
	
	if ( jh_log_names_buffer != NULL )
		return jh_log_names_buffer;
	
	// else figure out size, make buffer and copy data into it.

	LOG( "calculating storage size" );
	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		size += strlen(i->filename) + 1;
	}

	// if no file in list yet.
	if (size == 1) 
		return NULL;

	jh_log_names_buffer = (char*)LOGGING_MALLOC( size );	
	temp = jh_log_names_buffer;

	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		strcpy( temp, i->filename );
		temp += strlen( i->filename );
		*temp = ' ';
		temp++;
	}

	temp--;
	*temp = '\0';

	return jh_log_names_buffer;
}